

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrDeserializeSceneFragmentMSFT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *pvVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0 [32];
  ostringstream local_5a0 [8];
  ostringstream oss_buffer;
  __cxx11 local_428 [32];
  string local_408 [8];
  string buffer_array_prefix;
  uint local_3e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0 [4];
  uint32_t value_buffer_inc;
  ostringstream local_3c0 [8];
  ostringstream oss_buffer_array;
  string local_248 [8];
  string buffer_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228 [32];
  ostringstream local_208 [8];
  ostringstream oss_bufferSize;
  string local_90 [8];
  string buffersize_prefix;
  XrDeserializeSceneFragmentMSFT local_60 [2];
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *local_40;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *contents_local;
  string *psStack_30;
  bool is_pointer_local;
  string *type_string_local;
  string *prefix_local;
  XrDeserializeSceneFragmentMSFT *value_local;
  XrGeneratedDispatchTable *gen_dispatch_table_local;
  
  local_40 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents;
  contents_local._7_1_ = is_pointer;
  psStack_30 = type_string;
  type_string_local = prefix;
  prefix_local = (string *)value;
  value_local = (XrDeserializeSceneFragmentMSFT *)gen_dispatch_table;
  PointerToHexString<XrDeserializeSceneFragmentMSFT>(local_60);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  if ((contents_local._7_1_ & 1) == 0) {
    std::__cxx11::string::operator+=((string *)prefix,".");
  }
  else {
    std::__cxx11::string::operator+=((string *)prefix,"->");
  }
  std::__cxx11::string::string(local_90,(string *)prefix);
  std::__cxx11::string::operator+=(local_90,"bufferSize");
  std::__cxx11::ostringstream::ostringstream(local_208);
  poVar2 = std::operator<<((ostream *)local_208,"0x");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
  std::ostream::operator<<(poVar2,*(uint *)prefix_local);
  pvVar1 = local_40;
  std::__cxx11::ostringstream::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            (pvVar1,(char (*) [9])"uint32_t",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,local_228
            );
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::string::string(local_248,(string *)prefix);
  std::__cxx11::string::operator+=(local_248,"buffer");
  std::__cxx11::ostringstream::ostringstream(local_3c0);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_3c0,std::hex);
  std::operator<<(poVar2,*(uchar **)(prefix_local + 8));
  pvVar1 = local_40;
  std::__cxx11::ostringstream::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[15],std::__cxx11::string&,std::__cxx11::string>
            (pvVar1,(char (*) [15])"const uint8_t*",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
             local_3e0);
  std::__cxx11::string::~string((string *)local_3e0);
  for (local_3e4 = 0; local_3e4 < *(uint *)prefix_local; local_3e4 = local_3e4 + 1) {
    std::__cxx11::string::string(local_408,local_248);
    std::__cxx11::string::operator+=(local_408,"[");
    std::__cxx11::to_string(local_428,local_3e4);
    std::__cxx11::string::operator+=(local_408,(string *)local_428);
    std::__cxx11::string::~string((string *)local_428);
    std::__cxx11::string::operator+=(local_408,"]");
    std::__cxx11::ostringstream::ostringstream(local_5a0);
    poVar2 = std::operator<<((ostream *)local_5a0,"0x");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
    std::operator<<(poVar2,*(uchar *)(*(long *)(prefix_local + 8) + (ulong)local_3e4));
    pvVar1 = local_40;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[15],std::__cxx11::string&,std::__cxx11::string>
              (pvVar1,(char (*) [15])"const uint8_t*",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408,
               local_5c0);
    std::__cxx11::string::~string((string *)local_5c0);
    std::__cxx11::ostringstream::~ostringstream(local_5a0);
    std::__cxx11::string::~string(local_408);
  }
  gen_dispatch_table_local._7_1_ = 1;
  std::__cxx11::ostringstream::~ostringstream(local_3c0);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::ostringstream::~ostringstream(local_208);
  std::__cxx11::string::~string(local_90);
  return (bool)(gen_dispatch_table_local._7_1_ & 1);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrDeserializeSceneFragmentMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string buffersize_prefix = prefix;
        buffersize_prefix += "bufferSize";
        std::ostringstream oss_bufferSize;
        oss_bufferSize << "0x" << std::hex << (value->bufferSize);
        contents.emplace_back("uint32_t", buffersize_prefix, oss_bufferSize.str());
        std::string buffer_prefix = prefix;
        buffer_prefix += "buffer";
        std::ostringstream oss_buffer_array;
        oss_buffer_array << std::hex << (value->buffer);
        contents.emplace_back("const uint8_t*", buffer_prefix, oss_buffer_array.str());
        for (uint32_t value_buffer_inc = 0; value_buffer_inc < value->bufferSize; ++value_buffer_inc) {
            std::string buffer_array_prefix = buffer_prefix;
            buffer_array_prefix += "[";
            buffer_array_prefix += std::to_string(value_buffer_inc);
            buffer_array_prefix += "]";
            std::ostringstream oss_buffer;
            oss_buffer << "0x" << std::hex << (value->buffer[value_buffer_inc]);
            contents.emplace_back("const uint8_t*", buffer_array_prefix, oss_buffer.str());
        }
        return true;
    } catch(...) {
    }
    return false;
}